

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bz2_stream.cpp
# Opt level: O2

ssize_t __thiscall minibag::BZ2Stream::write(BZ2Stream *this,int __fd,void *__buf,size_t __n)

{
  uint64_t uVar1;
  ssize_t extraout_RAX;
  BagException *pBVar2;
  undefined4 in_register_00000034;
  allocator<char> local_39;
  string local_38;
  
  if (this->bzfile_ == (BZFILE *)0x0) {
    pBVar2 = (BagException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"cannot write to unopened bzfile",&local_39);
    BagException::BagException(pBVar2,&local_38);
    __cxa_throw(pBVar2,&BagException::typeinfo,std::runtime_error::~runtime_error);
  }
  BZ2_bzWrite(&this->bzerror_,this->bzfile_,(void *)CONCAT44(in_register_00000034,__fd),(int)__buf);
  if (this->bzerror_ != -6) {
    uVar1 = Stream::getCompressedIn(&this->super_Stream);
    Stream::setCompressedIn(&this->super_Stream,(long)__buf + uVar1);
    return extraout_RAX;
  }
  pBVar2 = (BagException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"BZ_IO_ERROR: error writing the compressed file",&local_39);
  BagException::BagException(pBVar2,&local_38);
  __cxa_throw(pBVar2,&BagException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void BZ2Stream::write(void* ptr, size_t size) {
    if (!bzfile_) {
        throw BagException("cannot write to unopened bzfile");
    }

    BZ2_bzWrite(&bzerror_, bzfile_, ptr, (int)size);

    switch (bzerror_) {
    case BZ_IO_ERROR: throw BagException("BZ_IO_ERROR: error writing the compressed file");
    }

    setCompressedIn(getCompressedIn() + size);
}